

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccmdutl.cpp
# Opt level: O0

char * CTcCommandUtil::get_opt_arg(int argc,char **argv,int *curarg,int optlen)

{
  int optlen_local;
  int *curarg_local;
  char **argv_local;
  int argc_local;
  char *local_8;
  
  if (argv[*curarg][optlen + 1] == '\0') {
    if (*curarg + 1 < argc) {
      *curarg = *curarg + 1;
      local_8 = argv[*curarg];
    }
    else {
      local_8 = (char *)0x0;
    }
  }
  else {
    local_8 = argv[*curarg] + (long)optlen + 1;
  }
  return local_8;
}

Assistant:

char *CTcCommandUtil::get_opt_arg(int argc, char **argv,
                                  int *curarg, int optlen)
{
    /* 
     *   if it's jammed up against the option letter, get it from the
     *   current array entry; otherwise, get it from the next array entry 
     */
    if (argv[*curarg][optlen + 1] != '\0')
    {
        /* it's attached to the same option entry */
        return argv[*curarg] + optlen + 1;
    }
    else if (*curarg + 1 < argc)
    {
        /* it's by itself as the next option entry */
        ++(*curarg);
        return argv[*curarg];
    }
    else
    {
        /* it's not present at all */
        return 0;
    }
}